

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void innalg(double *vec,int l,int N,double *v,double *theta)

{
  int M;
  int iVar1;
  double *acov_00;
  double *acov;
  double temp2;
  double temp;
  int index2;
  int index1;
  int ct2;
  int ct;
  int lag;
  int j;
  int i;
  double *theta_local;
  double *v_local;
  int N_local;
  int l_local;
  double *vec_local;
  
  M = N + 1;
  acov_00 = (double *)malloc((long)M << 3);
  autocovar(vec,l,acov_00,M);
  *v = *acov_00;
  for (lag = 0; lag < M; lag = lag + 1) {
    for (ct = 0; ct < M; ct = ct + 1) {
      theta[lag * M + ct] = 0.0;
    }
  }
  for (lag = 1; lag < M; lag = lag + 1) {
    iVar1 = lag * M;
    for (ct = 0; ct < lag; ct = ct + 1) {
      temp2 = 0.0;
      for (index1 = 0; index1 < ct; index1 = index1 + 1) {
        temp2 = theta[(ct * M + ct) - index1] * theta[(iVar1 + lag) - index1] * v[index1] + temp2;
      }
      theta[(iVar1 + lag) - ct] = ((acov_00[lag - ct] - temp2) * 1.0) / v[ct];
    }
    acov = (double *)0x0;
    for (index2 = 0; index2 < lag; index2 = index2 + 1) {
      acov = (double *)
             (v[index2] * theta[(iVar1 + lag) - index2] * theta[(iVar1 + lag) - index2] +
             (double)acov);
    }
    v[lag] = *v - (double)acov;
  }
  free(acov_00);
  return;
}

Assistant:

void innalg(double *vec, int l, int N,double *v, double *theta) {
	int i,j,lag,ct,ct2,index1,index2;
	double temp,temp2;
	double *acov;
	// IMPORTANT - The program does not store the matrix as laid out
	// in Brockwell and Davis

	// theta is a (N+1)X(N+1) matrix so choose the value of N accordingly. The recommended
	// value is N = 17 which will make theta a 18*18 double vector so allocate memory
	// accordingly.

	// theta11 is accessed at theta[1*(N+1) + 1]

	// with thetaxy accessed at theta[x*(N+1)+y]

	// The coefficients of Moving Average MA(q) are stored at
	// theta[N*(N+1)+1+i] where i = 0,1,2,...,q-1. Multiply these entries by -1.0
	// to get the MA(q) coefficients.

	// Output v is a 1X(N+1) vector with v[0] = autocovariance at lag 0.

	// see ma_inn function below

	lag = N+1;

	acov = (double*) malloc(sizeof(double) * lag);
	autocovar(vec,l,acov,lag);
	//mdisplay(acov,1,lag);
	v[0] = acov[0];

	for(i = 0; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < lag;++j) {
			theta[index1+j] = 0.0;
		}
	}

	for(i = 1; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < i;++j) {
			index2 = j * lag;
			temp = 0.0;
			for(ct = 0; ct < j;++ct) {
				temp += (theta[index2 + j - ct] * theta[index1 + i - ct]* v[ct]);
			}
			theta[index1 + i - j] = (acov[i-j]-temp)*1.0/v[j];
		}
		temp2 = 0.0;

		for(ct2 = 0; ct2 < i;++ct2) {
			temp2 += (v[ct2]*theta[index1 + i - ct2]*theta[index1 + i - ct2]);
		}

		v[i]=v[0]-temp2;
	}


	free(acov);
}